

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Benchmark::Detail::BenchmarkFunction::
model<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/extent_tests.cpp:199:5)>
::call(model<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_extent_tests_cpp:199:5)>
       *this,Chronometer meter)

{
  model<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_extent_tests_cpp:199:5)>
  *this_local;
  Chronometer meter_local;
  
  call(this,meter.impl,meter.k);
  return;
}

Assistant:

void call(Chronometer meter) const override {
                        call(meter, is_callable<Fun(Chronometer)>());
                    }